

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dep_for_basicchild_stdfunc.cpp
# Opt level: O1

void h(int *i,int s)

{
  spin_mutex_t sVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  
  success = f_finished;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"h begin: ",9);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"h received i=",0xd);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  *i = *i + s;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"h finish: ",10);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void h(int &i, int s) 
{
  success = f_finished;
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  std::cout << "h received i=" << i << std::endl;
  i += s;  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}